

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int enc_row_mt_worker_hook(void *arg1,void *unused)

{
  AV1_COMMON *cm_00;
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  AV1_COMP *cpi;
  pthread_mutex_t *ppVar4;
  AV1LfSync *pAVar5;
  TileDataEnc *pTVar6;
  ThreadData_conflict *td;
  FRAME_CONTEXT *__dest;
  MB_RD_RECORD *pMVar7;
  undefined8 *puVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  PC_TREE *pPVar23;
  TileDataEnc *pTVar24;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  AV1LfMTInfo *pAVar29;
  TileDataEnc *tile;
  int iVar30;
  int iVar31;
  int iVar32;
  bool bVar33;
  _Bool do_pipelined_lpf_mt_with_enc;
  AV1_COMMON *cm;
  AV1_COMMON *cm_1;
  
  cpi = *arg1;
  lVar21 = *(long *)((long)arg1 + 8);
  iVar19 = *(int *)((long)arg1 + 0x1cc);
  ppVar4 = (cpi->mt_info).enc_row_mt.mutex_;
  pAVar5 = *(AV1LfSync **)((long)arg1 + 0x1b8);
  *(aom_internal_error_info **)(lVar21 + 0x2b90) = (aom_internal_error_info *)((long)arg1 + 0x18);
  cm_00 = &cpi->common;
  if ((cpi->mt_info).pipeline_lpf_mt_with_enc == 0) {
    bVar33 = false;
  }
  else {
    bVar33 = true;
    if ((cpi->common).lf.filter_level[0] == 0) {
      bVar33 = (cpi->common).lf.filter_level[1] != 0;
    }
  }
  iVar14 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar14 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    iVar14 = ((cpi->common).seq_params)->mib_size_log2;
    iVar19 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[iVar19];
    if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
      *(undefined8 *)(*(long *)((long)arg1 + 8) + 0x26e50) = 0;
    }
    else {
      pPVar23 = av1_alloc_pc_tree_node(((cpi->common).seq_params)->sb_size);
      *(PC_TREE **)(*(long *)((long)arg1 + 8) + 0x26e50) = pPVar23;
      if (pPVar23 == (PC_TREE *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)(lVar21 + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
    }
    *(FRAME_CONTEXT **)(*(long *)((long)arg1 + 8) + 0x2b38) = (cpi->common).fc;
    bVar11 = false;
    do {
      pthread_mutex_lock((pthread_mutex_t *)ppVar4);
      bVar25 = (byte)iVar14;
      if ((cpi->mt_info).enc_row_mt.row_mt_exit == false) {
        pTVar6 = cpi->tile_data;
        iVar15 = pTVar6[iVar19].row_mt_sync.next_mi_row;
        if (iVar15 < pTVar6[iVar19].tile_info.mi_row_end) {
          iVar30 = ((cpi->common).seq_params)->mib_size;
          piVar9 = &pTVar6[iVar19].row_mt_sync.num_threads_working;
          *piVar9 = *piVar9 + 1;
          pTVar6[iVar19].row_mt_sync.next_mi_row = iVar30 + iVar15;
        }
        else {
          lVar21 = (long)(cpi->common).tiles.rows;
          if (lVar21 < 1) {
            iVar30 = -1;
          }
          else {
            uVar2 = (cpi->common).tiles.cols;
            iVar15 = 0x7fffffff;
            iVar30 = -1;
            iVar20 = 0;
            lVar27 = 0;
            iVar31 = 0;
            pTVar24 = pTVar6;
            do {
              uVar26 = (ulong)uVar2;
              tile = pTVar24;
              iVar32 = iVar20;
              if (0 < (int)uVar2) {
                do {
                  iVar16 = av1_get_sb_rows_in_tile(cm_00,&tile->tile_info);
                  iVar17 = av1_get_sb_cols_in_tile(cm_00,&tile->tile_info);
                  iVar17 = iVar17 + 1 >> 1;
                  if (iVar16 <= iVar17) {
                    iVar17 = iVar16;
                  }
                  iVar16 = (tile->row_mt_sync).num_threads_working;
                  iVar12 = iVar31;
                  iVar13 = iVar30;
                  if ((iVar16 < iVar17) &&
                     (iVar17 = (tile->tile_info).mi_row_end, iVar3 = (tile->row_mt_sync).next_mi_row
                     , iVar18 = iVar17 - iVar3, iVar18 != 0 && iVar3 <= iVar17)) {
                    iVar17 = iVar15;
                    if (iVar16 < iVar15) {
                      iVar31 = 0;
                      iVar17 = iVar16;
                    }
                    bVar10 = iVar15 < iVar16;
                    iVar15 = iVar17;
                    iVar12 = iVar18;
                    iVar13 = iVar32;
                    if (bVar10 || iVar18 <= iVar31) {
                      iVar12 = iVar31;
                      iVar13 = iVar30;
                    }
                  }
                  iVar30 = iVar13;
                  iVar31 = iVar12;
                  iVar32 = iVar32 + 1;
                  tile = tile + 1;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              lVar27 = lVar27 + 1;
              iVar20 = iVar20 + uVar2;
              pTVar24 = pTVar24 + uVar2;
            } while (lVar27 != lVar21);
          }
          if (iVar30 == -1) {
            bVar11 = true;
            iVar15 = -1;
          }
          else {
            iVar15 = pTVar6[iVar30].row_mt_sync.next_mi_row;
            iVar19 = iVar30;
            if (iVar15 < pTVar6[iVar30].tile_info.mi_row_end) {
              iVar20 = ((cpi->common).seq_params)->mib_size;
              piVar9 = &pTVar6[iVar30].row_mt_sync.num_threads_working;
              *piVar9 = *piVar9 + 1;
              pTVar6[iVar30].row_mt_sync.next_mi_row = iVar20 + iVar15;
            }
            else {
              iVar15 = -1;
            }
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
        iVar30 = 3;
        if (!bVar11) {
          pTVar24 = cpi->tile_data;
          pTVar6 = pTVar24 + iVar19;
          iVar30 = pTVar24[iVar19].tile_info.tile_row;
          iVar20 = pTVar24[iVar19].tile_info.tile_col;
          td = *(ThreadData_conflict **)((long)arg1 + 8);
          __dest = td->tctx;
          (td->mb).e_mbd.tile_ctx = __dest;
          (td->mb).tile_pb_ctx = &pTVar24[iVar19].tctx;
          td->abs_sum_level = 0;
          if ((pTVar24[iVar19].allow_update_cdf == '\0') ||
             ((td->mb).row_ctx = pTVar6->row_ctx, iVar15 == (pTVar6->tile_info).mi_row_start)) {
            memcpy(__dest,&pTVar24[iVar19].tctx,0x52fc);
          }
          uVar1 = ((cpi->common).seq_params)->monochrome;
          lVar21 = 0;
          do {
            (td->mb).e_mbd.above_entropy_context[lVar21] =
                 (cpi->common).above_contexts.entropy[lVar21][iVar30];
            lVar21 = lVar21 + 1;
          } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar21);
          (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[iVar30];
          (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[iVar30];
          cfl_init(&(td->mb).e_mbd.cfl,(cpi->common).seq_params);
          pMVar7 = (td->mb).txfm_search_info.mb_rd_record;
          if (pMVar7 != (MB_RD_RECORD *)0x0) {
            av1_crc32c_calculator_init(&pMVar7->crc_calculator);
          }
          av1_encode_sb_row(cpi,td,iVar30,iVar20,iVar15);
          pthread_mutex_lock((pthread_mutex_t *)ppVar4);
          pTVar6->abs_sum_level = pTVar6->abs_sum_level + td->abs_sum_level;
          piVar9 = &(pTVar6->row_mt_sync).num_threads_working;
          *piVar9 = *piVar9 + -1;
          piVar9 = (cpi->mt_info).enc_row_mt.num_tile_cols_done + (iVar15 >> (bVar25 & 0x1f));
          *piVar9 = *piVar9 + 1;
          pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
          pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
          iVar30 = 0;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
        *(undefined4 *)((long)arg1 + 0xe8) = 0;
        iVar30 = 1;
      }
    } while (iVar30 == 0);
    if (iVar30 == 3) {
      if (bVar33) {
        pAVar5 = *(AV1LfSync **)((long)arg1 + 0x1b8);
        bVar28 = (byte)((cpi->common).seq_params)->mib_size_log2;
        ppVar4 = (cpi->mt_info).enc_row_mt.mutex_;
        iVar19 = ((cpi->common).mi_params.mi_rows + (1 << (bVar28 & 0x1f)) + -1 >> (bVar28 & 0x1f))
                 + -1;
        do {
          pthread_mutex_lock((pthread_mutex_t *)pAVar5->job_mutex);
          if (pAVar5->lf_mt_exit == false) {
            iVar15 = pAVar5->jobs_dequeued;
            if (pAVar5->jobs_enqueued <= iVar15) goto LAB_001c525d;
            pAVar29 = pAVar5->job_queue + iVar15;
            pAVar5->jobs_dequeued = iVar15 + 1;
          }
          else {
LAB_001c525d:
            pAVar29 = (AV1LfMTInfo *)0x0;
          }
          pthread_mutex_unlock((pthread_mutex_t *)pAVar5->job_mutex);
          if (pAVar29 == (AV1LfMTInfo *)0x0) break;
          puVar8 = *(undefined8 **)((long)arg1 + 0x1c0);
          iVar15 = pAVar29->mi_row;
          iVar30 = pAVar29->lpf_opt_level;
          pthread_mutex_lock((pthread_mutex_t *)ppVar4);
          if ((cpi->mt_info).enc_row_mt.row_mt_exit != false) {
LAB_001c538e:
            pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
            break;
          }
          iVar15 = iVar15 >> (bVar25 & 0x1f);
          iVar20 = iVar15 + 1;
          if (iVar19 < iVar20) {
            iVar20 = iVar19;
          }
          bVar28 = 0;
          while( true ) {
            piVar9 = (cpi->mt_info).enc_row_mt.num_tile_cols_done;
            iVar31 = (cpi->common).tiles.cols;
            if ((iVar31 <= piVar9[iVar15]) && (iVar31 <= piVar9[iVar20])) break;
            pthread_cond_wait((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_,
                              (pthread_mutex_t *)ppVar4);
            bVar28 = (cpi->mt_info).enc_row_mt.row_mt_exit;
            if ((_Bool)bVar28 != false) goto LAB_001c538e;
          }
          pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
          if ((bVar28 & 1) != 0) break;
          av1_thread_loop_filter_rows
                    ((YV12_BUFFER_CONFIG *)*puVar8,(AV1_COMMON *)puVar8[1],
                     (macroblockd_plane *)(puVar8 + 2),(MACROBLOCKD *)puVar8[0x3d4],pAVar29->mi_row,
                     pAVar29->plane,pAVar29->dir,iVar30,pAVar5,
                     (aom_internal_error_info *)((long)arg1 + 0x18),
                     (AV1_DEBLOCKING_PARAMETERS *)(puVar8 + 0x3d5),(TX_SIZE *)(puVar8 + 0x415),
                     iVar14);
        } while( true );
      }
      av1_free_pc_tree_recursive
                (*(PC_TREE **)(*(long *)((long)arg1 + 8) + 0x26e50),
                 (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,0,0,
                 (cpi->sf).part_sf.partition_search_type);
      *(undefined8 *)(*(long *)((long)arg1 + 8) + 0x26e50) = 0;
      *(undefined4 *)((long)arg1 + 0xe8) = 0;
    }
    iVar19 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)ppVar4);
    (cpi->mt_info).enc_row_mt.row_mt_exit = true;
    pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
    pthread_mutex_unlock((pthread_mutex_t *)ppVar4);
    lVar21 = (long)(cpi->common).tiles.rows;
    if (0 < lVar21) {
      iVar19 = ((cpi->common).seq_params)->mib_size;
      uVar2 = (cpi->common).tiles.cols;
      lVar27 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar22 = lVar27 * (ulong)uVar2;
          uVar26 = 0;
          do {
            pTVar6 = cpi->tile_data;
            iVar15 = av1_get_sb_cols_in_tile(cm_00,&pTVar6[uVar26 + lVar22].tile_info);
            iVar14 = pTVar6[uVar26 + lVar22].tile_info.mi_row_start;
            if (iVar14 < pTVar6[uVar26 + lVar22].tile_info.mi_row_end) {
              iVar30 = 0;
              do {
                iVar14 = iVar14 + iVar19;
                (*(cpi->mt_info).enc_row_mt.sync_write_ptr)
                          (&pTVar6[uVar26 + lVar22].row_mt_sync,iVar30,iVar15 + -1,iVar15);
                iVar30 = iVar30 + 1;
              } while (iVar14 < pTVar6[uVar26 + lVar22].tile_info.mi_row_end);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar2);
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != lVar21);
    }
    if (bVar33) {
      pthread_mutex_lock((pthread_mutex_t *)pAVar5->job_mutex);
      pAVar5->lf_mt_exit = true;
      pthread_mutex_unlock((pthread_mutex_t *)pAVar5->job_mutex);
      av1_set_vert_loop_filter_done(cm_00,pAVar5,((cpi->common).seq_params)->mib_size_log2);
    }
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

static int enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  AV1LfSync *const lf_sync = thread_data->lf_sync;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;
  AV1_COMMON *volatile const cm = &cpi->common;
  volatile const bool do_pipelined_lpf_mt_with_enc = lpf_mt_with_enc_enabled(
      cpi->mt_info.pipeline_lpf_mt_with_enc, cm->lf.filter_level);

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->row_mt_exit = true;
    // Wake up all the workers waiting in launch_loop_filter_rows() to exit in
    // case of an error.
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_encoding_done(cpi);

    if (do_pipelined_lpf_mt_with_enc) {
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(lf_sync->job_mutex);
      lf_sync->lf_mt_exit = true;
      pthread_mutex_unlock(lf_sync->job_mutex);
#endif
      av1_set_vert_loop_filter_done(&cpi->common, lf_sync,
                                    cpi->common.seq_params->mib_size_log2);
    }
    return 0;
  }
  error_info->setjmp = 1;

  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  int end_of_frame = 0;
  bool row_mt_exit = false;

  // When master thread does not have a valid job to process, xd->tile_ctx
  // is not set and it contains NULL pointer. This can result in NULL pointer
  // access violation if accessed beyond the encode stage. Hence, updating
  // thread_data->td->mb.e_mbd.tile_ctx is initialized with common frame
  // context to avoid NULL pointer access in subsequent stages.
  thread_data->td->mb.e_mbd.tile_ctx = cm->fc;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_exit = enc_row_mt->row_mt_exit;
    // row_mt_exit check here can be avoided as it is checked after
    // sync_read_ptr() in encode_sb_row(). However, checking row_mt_exit here,
    // tries to return before calling the function get_next_job().
    if (!row_mt_exit &&
        !get_next_job(&cpi->tile_data[cur_tile_id], &current_mi_row,
                      cm->seq_params->mib_size)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 0,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When row_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (row_mt_exit) {
      error_info->setjmp = 0;
      return 1;
    }

    if (end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    const TileInfo *const tile_info = &this_tile->tile_info;
    const int tile_row = tile_info->tile_row;
    const int tile_col = tile_info->tile_col;
    ThreadData *td = thread_data->td;
    const int sb_row = current_mi_row >> mib_size_log2;

    assert(current_mi_row != -1 && current_mi_row <= tile_info->mi_row_end);

    td->mb.e_mbd.tile_ctx = td->tctx;
    td->mb.tile_pb_ctx = &this_tile->tctx;
    td->abs_sum_level = 0;

    if (this_tile->allow_update_cdf) {
      td->mb.row_ctx = this_tile->row_ctx;
      if (current_mi_row == tile_info->mi_row_start)
        memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    } else {
      memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    }

    av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                           &td->mb.e_mbd);
#if !CONFIG_REALTIME_ONLY
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif
    if (td->mb.txfm_search_info.mb_rd_record != NULL) {
      av1_crc32c_calculator_init(
          &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
    }

    av1_encode_sb_row(cpi, td, tile_row, tile_col, current_mi_row);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    this_tile->abs_sum_level += td->abs_sum_level;
    row_mt_sync->num_threads_working--;
    enc_row_mt->num_tile_cols_done[sb_row]++;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  if (do_pipelined_lpf_mt_with_enc) {
    // Loop-filter a superblock row if encoding of the current and next
    // superblock row is complete.
    // TODO(deepa.kg @ittiam.com) Evaluate encoder speed by interleaving
    // encoding and loop filter stage.
    launch_loop_filter_rows(cm, thread_data, enc_row_mt, mib_size_log2);
  }
  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}